

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O2

void __thiscall
ktx::CommandExtract::decodeAndSaveASTC
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,char *compressedData,
          size_t compressedSize)

{
  undefined8 uVar1;
  VkFormat vkFormat_00;
  __array data;
  bool bVar2;
  astcenc_error aVar3;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  uint uVar4;
  ulong __n;
  ASTCencStruct astcenc;
  __array uncompressedBuffer;
  astcenc_image local_158;
  string local_140;
  uchar *bufferPtr;
  FormatDescriptor local_118;
  astcenc_config config;
  
  uVar1 = *(undefined8 *)&format->basic;
  uVar4 = (uint)((ulong)uVar1 >> 0x20);
  bVar2 = isFormatSRGB(vkFormat);
  config.tune_3partition_early_out_limit_factor = 0.0;
  config.tune_2plane_early_out_limit_correlation = 0.0;
  config.tune_search_mode0_enable = 0.0;
  config._108_4_ = 0;
  config.tune_4partitioning_candidate_limit = 0;
  config.tune_db_limit = 0.0;
  config.tune_mse_overshoot = 0.0;
  config.tune_2partition_early_out_limit_factor = 0.0;
  config.tune_refinement_limit = 0;
  config.tune_candidate_limit = 0;
  config.tune_2partitioning_candidate_limit = 0;
  config.tune_3partitioning_candidate_limit = 0;
  config.tune_2partition_index_limit = 0;
  config.tune_3partition_index_limit = 0;
  config.tune_4partition_index_limit = 0;
  config.tune_block_mode_limit = 0;
  config.cw_a_weight = 0.0;
  config.a_scale_radius = 0;
  config.rgbm_m_scale = 0.0;
  config.tune_partition_count_limit = 0;
  config.block_z = 0;
  config.cw_r_weight = 0.0;
  config.cw_g_weight = 0.0;
  config.cw_b_weight = 0.0;
  config.profile = ASTCENC_PRF_LDR_SRGB;
  config.flags = 0;
  config.block_x = 0;
  config.block_y = 0;
  config.progress_callback = (astcenc_progress_callback)0x0;
  aVar3 = astcenc_config_init((uint)!bVar2,(uVar4 & 0xff) + 1,(uVar4 >> 8 & 0xff) + 1,
                              ((ushort)((ulong)uVar1 >> 0x30) & 0xff) + 1,60.0,0x10,&config);
  if (aVar3 != ASTCENC_SUCCESS) {
    local_118.basic._0_8_ = astcenc_get_error_string(aVar3);
    Reporter::fatal<char_const(&)[34],char_const*>
              (&(this->super_Command).super_Reporter,DFD_FAILURE,
               (char (*) [34])"ASTC Codec config init failed: {}",(char **)&local_118);
  }
  astcenc.context = (astcenc_context *)0x0;
  aVar3 = astcenc_context_alloc(&config,1,&astcenc.context);
  if (aVar3 != ASTCENC_SUCCESS) {
    local_118.basic._0_8_ = astcenc_get_error_string(aVar3);
    Reporter::fatal<char_const(&)[36],char_const*>
              (&(this->super_Command).super_Reporter,DFD_FAILURE,
               (char (*) [36])"ASTC Codec context alloc failed: {}",(char **)&local_118);
  }
  local_158.dim_y = height;
  local_158.dim_z = 1;
  __n = (ulong)(width * height * 4);
  local_158.dim_x = width;
  __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)operator_new__(__n);
  memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                 _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
  local_158.data = &bufferPtr;
  local_158.data_type = ASTCENC_TYPE_U8;
  uncompressedBuffer._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  bufferPtr = (uchar *)__s.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  aVar3 = astcenc_decompress_image
                    (astcenc.context,(uchar *)compressedData,compressedSize,&local_158,
                     &decodeAndSaveASTC::swizzle,0);
  if (aVar3 != ASTCENC_SUCCESS) {
    local_118.basic._0_8_ = astcenc_get_error_string(aVar3);
    Reporter::fatal<char_const(&)[33],char_const*>
              (&(this->super_Command).super_Reporter,DFD_FAILURE,
               (char (*) [33])"ASTC Codec decompress failed: {}",(char **)&local_118);
  }
  astcenc_decompress_reset(astcenc.context);
  bVar2 = isFormatSRGB(vkFormat);
  vkFormat_00 = VK_FORMAT_R8G8B8A8_UNORM;
  if (bVar2) {
    vkFormat_00 = VK_FORMAT_R8G8B8A8_SRGB;
  }
  std::__cxx11::string::string((string *)&local_140,(string *)filepath);
  data = uncompressedBuffer;
  createFormatDescriptor(&local_118,vkFormat_00,&(this->super_Command).super_Reporter);
  saveImageFile(this,&local_140,appendExtension,
                (char *)data._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,__n,vkFormat_00,
                &local_118,width,height);
  FormatDescriptor::~FormatDescriptor(&local_118);
  std::__cxx11::string::~string((string *)&local_140);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&uncompressedBuffer);
  decodeAndSaveASTC::ASTCencStruct::~ASTCencStruct(&astcenc);
  return;
}

Assistant:

void CommandExtract::decodeAndSaveASTC(std::string filepath, bool appendExtension, VkFormat vkFormat, const FormatDescriptor& format,
        uint32_t width, uint32_t height, const char* compressedData, std::size_t compressedSize) {

    const auto threadCount = 1u;
    const auto blockSizeX = format.basic.texelBlockDimension0 + 1u;
    const auto blockSizeY = format.basic.texelBlockDimension1 + 1u;
    const auto blockSizeZ = format.basic.texelBlockDimension2 + 1u;
    static constexpr astcenc_swizzle swizzle{ASTCENC_SWZ_R, ASTCENC_SWZ_G, ASTCENC_SWZ_B, ASTCENC_SWZ_A};

    astcenc_error ec = ASTCENC_SUCCESS;

    const astcenc_profile profile = isFormatSRGB(vkFormat) ? ASTCENC_PRF_LDR_SRGB : ASTCENC_PRF_LDR;
    astcenc_config config{};
    ec = astcenc_config_init(profile, blockSizeX, blockSizeY, blockSizeZ, ASTCENC_PRE_MEDIUM, ASTCENC_FLG_DECOMPRESS_ONLY, &config);
    if (ec != ASTCENC_SUCCESS)
        fatal(rc::RUNTIME_ERROR, "ASTC Codec config init failed: {}", astcenc_get_error_string(ec));

    struct ASTCencStruct {
        astcenc_context* context = nullptr;
        ~ASTCencStruct() {
            astcenc_context_free(context);
        }
    } astcenc;
    astcenc_context*& context = astcenc.context;

    ec = astcenc_context_alloc(&config, threadCount, &context);
    if (ec != ASTCENC_SUCCESS)
        fatal(rc::RUNTIME_ERROR, "ASTC Codec context alloc failed: {}", astcenc_get_error_string(ec));

    astcenc_image image{};
    image.dim_x = width;
    image.dim_y = height;
    image.dim_z = 1; // 3D ASTC formats are currently not supported
    const auto uncompressedSize = width * height * 4 * sizeof(uint8_t);
    const auto uncompressedBuffer = std::make_unique<uint8_t[]>(uncompressedSize);
    auto* bufferPtr = uncompressedBuffer.get();
    image.data = reinterpret_cast<void**>(&bufferPtr);
    image.data_type = ASTCENC_TYPE_U8;

    ec = astcenc_decompress_image(context, reinterpret_cast<const uint8_t*>(compressedData), compressedSize, &image, &swizzle, 0);
    if (ec != ASTCENC_SUCCESS)
        fatal(rc::RUNTIME_ERROR, "ASTC Codec decompress failed: {}", astcenc_get_error_string(ec));
    astcenc_decompress_reset(context);

    const auto uncompressedVkFormat = isFormatSRGB(vkFormat) ?
            VK_FORMAT_R8G8B8A8_SRGB :
            VK_FORMAT_R8G8B8A8_UNORM;
    saveImageFile(
            std::move(filepath),
            appendExtension,
            reinterpret_cast<const char*>(uncompressedBuffer.get()),
            uncompressedSize,
            uncompressedVkFormat,
            createFormatDescriptor(uncompressedVkFormat, *this),
            width,
            height);
}